

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O0

image * __thiscall
basisu::image::extract_block_clamped
          (image *this,color_rgba *pDst,uint32_t src_x,uint32_t src_y,uint32_t w,uint32_t h)

{
  anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1 *paVar1;
  color_rgba *__src;
  int in_ECX;
  int in_EDX;
  anon_union_4_2_6eba8969_for_color_rgba_0 *in_RSI;
  image *in_RDI;
  uint in_R8D;
  uint in_R9D;
  uint32_t y_1;
  color_rgba *pSrc;
  uint32_t x;
  uint32_t y;
  size_t in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  uint uVar2;
  image *in_stack_ffffffffffffffd0;
  uint local_28;
  uint local_24;
  anon_union_4_2_6eba8969_for_color_rgba_0 *local_10;
  
  local_10 = in_RSI;
  if ((in_RDI->m_width < in_EDX + in_R8D) || (in_RDI->m_height < in_ECX + in_R9D)) {
    for (local_24 = 0; local_24 < in_R9D; local_24 = local_24 + 1) {
      for (local_28 = 0; local_28 < in_R8D; local_28 = local_28 + 1) {
        paVar1 = (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1 *)
                 get_clamped(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                             in_stack_ffffffffffffffc8);
        local_10->field_1 = *paVar1;
        local_10 = local_10 + 1;
      }
    }
  }
  else {
    __src = vector<basisu::color_rgba>::operator[]
                      ((vector<basisu::color_rgba> *)in_RDI,in_stack_ffffffffffffffb8);
    for (uVar2 = 0; uVar2 < in_R9D; uVar2 = uVar2 + 1) {
      memcpy(local_10,__src,(ulong)in_R8D << 2);
      __src = __src + in_RDI->m_pitch;
      local_10 = local_10 + in_R8D;
    }
  }
  return in_RDI;
}

Assistant:

const image &extract_block_clamped(color_rgba *pDst, uint32_t src_x, uint32_t src_y, uint32_t w, uint32_t h) const
		{
			if (((src_x + w) > m_width) || ((src_y + h) > m_height))
			{
				// Slower clamping case
				for (uint32_t y = 0; y < h; y++)
					for (uint32_t x = 0; x < w; x++)
						*pDst++ = get_clamped(src_x + x, src_y + y);
			}
			else
			{
				const color_rgba* pSrc = &m_pixels[src_x + src_y * m_pitch];

				for (uint32_t y = 0; y < h; y++)
				{
					memcpy(pDst, pSrc, w * sizeof(color_rgba));
					pSrc += m_pitch;
					pDst += w;
				}
			}

			return *this;
		}